

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.h
# Opt level: O1

bool __thiscall
SGParser::TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>::
Advance(TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
        *this)

{
  LineOffsetPosTracker *pLVar1;
  bool bVar2;
  uint uVar3;
  
  pLVar1 = this->Pos;
  if (this->Character == 9) {
    pLVar1->Offset = pLVar1->Offset + 4;
  }
  else if (this->Character == 10) {
    pLVar1->Line = pLVar1->Line + 1;
    pLVar1->Offset = 0;
  }
  else {
    pLVar1->Offset = pLVar1->Offset + 1;
  }
  bVar2 = TokenizerBase::AdvanceTail((this->Reader).Tok);
  uVar3 = 0;
  if (bVar2) {
    uVar3 = (uint)(byte)*((this->Reader).Tok)->pTail;
  }
  this->Character = uVar3;
  return bVar2;
}

Assistant:

bool Advance() {
        Pos.AdvanceChar(Character);
        Pos.AdvanceByte();
        const bool hasAdvanced = Reader.Advance();
        Character              = hasAdvanced ? Reader.GetByte() : 0u;
        return hasAdvanced;
    }